

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_errctl_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint local_30;
  int32_t itc;
  int32_t spr;
  int32_t wst;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  if (env->itc_tag == (MemoryRegion *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = (uint)arg1 & 0x4000000;
  }
  env->CP0_ErrCtl = (uint)arg1 & 0x30000000 | local_30;
  if (((local_30 == 0) || ((arg1 & 0x20000000) != 0)) || ((arg1 & 0x10000000) != 0)) {
    env->hflags = env->hflags & 0xf7ffffff;
  }
  else {
    env->hflags = env->hflags | 0x8000000;
  }
  return;
}

Assistant:

void helper_mtc0_errctl(CPUMIPSState *env, target_ulong arg1)
{
    int32_t wst = arg1 & (1 << CP0EC_WST);
    int32_t spr = arg1 & (1 << CP0EC_SPR);
    int32_t itc = env->itc_tag ? (arg1 & (1 << CP0EC_ITC)) : 0;

    env->CP0_ErrCtl = wst | spr | itc;

    if (itc && !wst && !spr) {
        env->hflags |= MIPS_HFLAG_ITC_CACHE;
    } else {
        env->hflags &= ~MIPS_HFLAG_ITC_CACHE;
    }
}